

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

int kget_int64(kstring_t *k,size_t *pos,int64_t *val_p)

{
  bool bVar1;
  ulong local_40;
  size_t p;
  int64_t val;
  int sign;
  int64_t *val_p_local;
  size_t *pos_local;
  kstring_t *k_local;
  
  val._4_4_ = 1;
  p = 0;
  local_40 = *pos;
  while( true ) {
    bVar1 = false;
    if ((local_40 < k->l) && (bVar1 = true, k->s[local_40] != ' ')) {
      bVar1 = k->s[local_40] == '\t';
    }
    if (!bVar1) break;
    local_40 = local_40 + 1;
  }
  if ((local_40 < k->l) && (k->s[local_40] == '-')) {
    val._4_4_ = -1;
    local_40 = local_40 + 1;
  }
  if (((local_40 < k->l) && ('/' < k->s[local_40])) && (k->s[local_40] < ':')) {
    while( true ) {
      bVar1 = false;
      if ((local_40 < k->l) && (bVar1 = false, '/' < k->s[local_40])) {
        bVar1 = k->s[local_40] < ':';
      }
      if (!bVar1) break;
      p = (p * 10 + (long)k->s[local_40]) - 0x30;
      local_40 = local_40 + 1;
    }
    *pos = local_40;
    *val_p = (long)val._4_4_ * p;
    k_local._4_4_ = 0;
  }
  else {
    k_local._4_4_ = -1;
  }
  return k_local._4_4_;
}

Assistant:

static int kget_int64(kstring_t *k, size_t *pos, int64_t *val_p) {
    int sign = 1;
    int64_t val = 0;
    size_t p = *pos;

    while (p < k->l && (k->s[p] == ' ' || k->s[p] == '\t'))
	   p++;

    if (p < k->l && k->s[p] == '-')
	sign = -1, p++;

    if (p >= k->l || !(k->s[p] >= '0' && k->s[p] <= '9'))
	return -1;

    while (p < k->l && k->s[p] >= '0' && k->s[p] <= '9')
	val = val*10 + k->s[p++]-'0';
    
    *pos = p;
    *val_p = sign*val;

    return 0;
}